

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O3

int equal_case(CBS *a,CBS *b)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar3 = 0;
  if (a->len == b->len) {
    if (a->len != 0) {
      puVar1 = a->data;
      puVar2 = b->data;
      uVar5 = 0;
      do {
        iVar3 = OPENSSL_tolower((uint)puVar1[uVar5]);
        iVar4 = OPENSSL_tolower((uint)puVar2[uVar5]);
        if (iVar3 != iVar4) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < a->len);
      return (uint)(iVar3 == iVar4);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }